

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O0

bool __thiscall MeCab::Param::load(Param *this,char *filename)

{
  char *in_RSI;
  ifstream ifs;
  allocator local_479;
  string local_478 [39];
  allocator in_stack_fffffffffffffbaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  Param *in_stack_fffffffffffffbc0;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [55];
  allocator local_239;
  string local_238 [32];
  undefined1 local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"800",&local_239);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"BOS/EOS,*,*,*,*,*,*,*,*",&local_271);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"8",&local_299);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"4",&local_2c1);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"%pS%f[7]",&local_2e9);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"%M",&local_311);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"\n",&local_339);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"%m\t%F-[0,1,2,3]\n",&local_361);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"EOS\n",&local_389);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b0,"%m\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",&local_3b1);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"%m\t%m\t%m\t%F-[0,1,2,3]\t\t\n",&local_3d9);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"EOS\n",&local_401);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_428,"%M\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",&local_429);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffbb0,"%M\t%m\t%m\t%F-[0,1,2,3]\t\t\n",
             (allocator *)&stack0xfffffffffffffbaf);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"EOS\n",&local_479);
  set<std::__cxx11::string>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (bool)in_stack_fffffffffffffbaf);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::ifstream::~ifstream(local_218);
  return true;
}

Assistant:

bool Param::load(const char *filename) {
  std::ifstream ifs(WPATH(filename));

  /* for Open JTalk
  CHECK_FALSE(ifs) << "no such file or directory: " << filename;

  std::string line;
  while (std::getline(ifs, line)) {
    if (!line.size() ||
        (line.size() && (line[0] == ';' || line[0] == '#'))) continue;

    size_t pos = line.find('=');
    CHECK_FALSE(pos != std::string::npos) << "format error: " << line;

    size_t s1, s2;
    for (s1 = pos+1; s1 < line.size() && isspace(line[s1]); s1++);
    for (s2 = pos-1; static_cast<long>(s2) >= 0 && isspace(line[s2]); s2--);
    const std::string value = line.substr(s1, line.size() - s1);
    const std::string key   = line.substr(0, s2 + 1);
    set<std::string>(key.c_str(), value, false);
  }
  */
  set<std::string>("cost-factor","800",false);
  set<std::string>("bos-feature","BOS/EOS,*,*,*,*,*,*,*,*",false);
  set<std::string>("eval-size","8",false);
  set<std::string>("unk-eval-size","4",false);
  set<std::string>("node-format-yomi","%pS%f[7]",false);
  set<std::string>("unk-format-yomi","%M",false);
  set<std::string>("eos-format-yomi","\n",false);
  set<std::string>("node-format-simple","%m\t%F-[0,1,2,3]\n",false);
  set<std::string>("eos-format-simple","EOS\n",false);
  set<std::string>("node-format-chasen","%m\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",false);
  set<std::string>("unk-format-chasen","%m\t%m\t%m\t%F-[0,1,2,3]\t\t\n",false);
  set<std::string>("eos-format-chasen","EOS\n",false);
  set<std::string>("node-format-chasen2","%M\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",false);
  set<std::string>("unk-format-chasen2","%M\t%m\t%m\t%F-[0,1,2,3]\t\t\n",false);
  set<std::string>("eos-format-chasen2","EOS\n",false);

  return true;
}